

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Percentile.cpp
# Opt level: O1

void __thiscall Percentile::generateCode(Percentile *this)

{
  undefined8 *puVar1;
  bool bVar2;
  Percentile *this_00;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_t sVar6;
  Attribute *pAVar7;
  Attribute *pAVar8;
  ostream *poVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong *puVar12;
  long *plVar13;
  ulong uVar14;
  size_type *psVar15;
  char cVar16;
  undefined8 uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong uVar19;
  string printPerc;
  string __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  string __str_1;
  string runFunction;
  string printPercTensorFlow;
  string __str_4;
  string percentileComp;
  string numPercStr;
  ofstream ofs;
  ulong *local_8f8;
  long local_8f0;
  ulong local_8e8;
  long lStack_8e0;
  ulong *local_8d8;
  long local_8d0;
  ulong local_8c8;
  long lStack_8c0;
  ulong *local_8b8;
  long local_8b0;
  ulong local_8a8;
  long lStack_8a0;
  ulong *local_898;
  long local_890;
  ulong local_888;
  long lStack_880;
  ulong *local_878;
  long local_870;
  ulong local_868;
  long lStack_860;
  long *local_858;
  long local_850;
  long local_848;
  long lStack_840;
  ulong *local_838;
  long local_830;
  ulong local_828;
  long lStack_820;
  ulong *local_818;
  long local_810;
  ulong local_808;
  long lStack_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  ulong *local_7d8;
  long local_7d0;
  ulong local_7c8;
  long lStack_7c0;
  ulong *local_7b8;
  long local_7b0;
  ulong local_7a8;
  long lStack_7a0;
  ulong *local_798;
  long local_790;
  ulong local_788;
  long lStack_780;
  ulong *local_778;
  long local_770;
  ulong local_768;
  long lStack_760;
  ulong *local_758;
  long local_750;
  ulong local_748;
  long lStack_740;
  ulong *local_738;
  long local_730;
  ulong local_728;
  long lStack_720;
  ulong *local_718;
  long local_710;
  ulong local_708;
  long lStack_700;
  ulong *local_6f8;
  long local_6f0;
  ulong local_6e8;
  long lStack_6e0;
  ulong *local_6d8;
  long local_6d0;
  ulong local_6c8;
  long lStack_6c0;
  ulong *local_6b8;
  long local_6b0;
  ulong local_6a8;
  long lStack_6a0;
  ulong *local_698;
  long local_690;
  ulong local_688;
  long lStack_680;
  ulong *local_678;
  long local_670;
  ulong local_668;
  undefined8 uStack_660;
  ulong *local_658;
  long local_650;
  ulong local_648;
  long lStack_640;
  ulong *local_638;
  long local_630;
  ulong local_628;
  long lStack_620;
  long *local_618;
  long local_610;
  long local_608;
  long lStack_600;
  ulong *local_5f8;
  long local_5f0;
  ulong local_5e8;
  long lStack_5e0;
  long *local_5d8;
  long local_5d0;
  long local_5c8;
  long lStack_5c0;
  string local_5b8;
  ulong *local_598;
  long local_590;
  ulong local_588;
  long lStack_580;
  ulong *local_578;
  long local_570;
  ulong local_568;
  undefined8 uStack_560;
  ulong *local_558;
  long local_550;
  ulong local_548;
  long lStack_540;
  ulong *local_538;
  long local_530;
  ulong local_528;
  long lStack_520;
  ulong *local_518;
  long local_510;
  ulong local_508;
  long lStack_500;
  ulong *local_4f8;
  long local_4f0;
  ulong local_4e8;
  long lStack_4e0;
  ulong *local_4d8;
  long local_4d0;
  ulong local_4c8;
  long lStack_4c0;
  ulong *local_4b8;
  long local_4b0;
  ulong local_4a8;
  undefined8 uStack_4a0;
  ulong *local_498;
  long local_490;
  ulong local_488;
  long lStack_480;
  ulong *local_478;
  long local_470;
  ulong local_468;
  long lStack_460;
  ulong *local_458;
  long local_450;
  ulong local_448;
  long lStack_440;
  ulong *local_438;
  long local_430;
  ulong local_428 [2];
  undefined8 *local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  Percentile *local_3f8;
  ulong *local_3f0;
  uint local_3e8;
  undefined4 uStack_3e4;
  ulong local_3e0 [2];
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0 [2];
  ulong *local_3b0;
  long local_3a8;
  ulong local_3a0 [2];
  ulong *local_390;
  long local_388;
  ulong local_380 [2];
  ulong *local_370;
  long local_368;
  ulong local_360 [2];
  ulong *local_350;
  long local_348;
  ulong local_340 [2];
  ulong *local_330;
  long local_328;
  ulong local_320 [2];
  ulong *local_310;
  long local_308;
  ulong local_300 [2];
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0 [2];
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0 [2];
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0 [2];
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  undefined2 *local_250 [2];
  undefined2 local_240 [8];
  long *local_230;
  undefined8 local_228;
  long local_220;
  undefined8 uStack_218;
  ios_base local_138 [264];
  
  puVar12 = *(ulong **)
             &((*(this->varToQuery[100]->_aggregates).
                 super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                 super__Vector_impl_data._M_start)->_incoming).
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct((ulong)local_250,'\x02');
  *local_250[0] = 0x3032;
  local_598 = &local_588;
  std::__cxx11::string::_M_construct((ulong)&local_598,'\x06');
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_598);
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_728 = *puVar10;
    lStack_720 = plVar4[3];
    local_738 = &local_728;
  }
  else {
    local_728 = *puVar10;
    local_738 = (ulong *)*plVar4;
  }
  local_730 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar19 = *puVar12;
  cVar16 = '\x01';
  if (9 < uVar19) {
    uVar11 = uVar19;
    cVar3 = '\x04';
    do {
      cVar16 = cVar3;
      if (uVar11 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_0019a4e7;
      }
      if (uVar11 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_0019a4e7;
      }
      if (uVar11 < 10000) goto LAB_0019a4e7;
      bVar2 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar3 = cVar16 + '\x04';
    } while (bVar2);
    cVar16 = cVar16 + '\x01';
  }
LAB_0019a4e7:
  local_6b8 = &local_6a8;
  std::__cxx11::string::_M_construct((ulong)&local_6b8,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6b8,(uint)local_6b0,uVar19);
  uVar19 = 0xf;
  if (local_738 != &local_728) {
    uVar19 = local_728;
  }
  if (uVar19 < (ulong)(local_6b0 + local_730)) {
    uVar19 = 0xf;
    if (local_6b8 != &local_6a8) {
      uVar19 = local_6a8;
    }
    if (uVar19 < (ulong)(local_6b0 + local_730)) goto LAB_0019a56b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_6b8,0,(char *)0x0,(ulong)local_738);
  }
  else {
LAB_0019a56b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_738,(ulong)local_6b8);
  }
  local_5d8 = &local_5c8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_5c8 = *plVar4;
    lStack_5c0 = puVar5[3];
  }
  else {
    local_5c8 = *plVar4;
    local_5d8 = (long *)*puVar5;
  }
  local_5d0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5d8);
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_648 = *puVar10;
    lStack_640 = plVar4[3];
    local_658 = &local_648;
  }
  else {
    local_648 = *puVar10;
    local_658 = (ulong *)*plVar4;
  }
  local_650 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar19 = puVar12[1];
  cVar16 = '\x01';
  if (9 < uVar19) {
    uVar11 = uVar19;
    cVar3 = '\x04';
    do {
      cVar16 = cVar3;
      if (uVar11 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_0019a6b3;
      }
      if (uVar11 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_0019a6b3;
      }
      if (uVar11 < 10000) goto LAB_0019a6b3;
      bVar2 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar3 = cVar16 + '\x04';
    } while (bVar2);
    cVar16 = cVar16 + '\x01';
  }
LAB_0019a6b3:
  local_8b8 = &local_8a8;
  std::__cxx11::string::_M_construct((ulong)&local_8b8,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_8b8,(uint)local_8b0,uVar19);
  uVar19 = 0xf;
  if (local_658 != &local_648) {
    uVar19 = local_648;
  }
  if (uVar19 < (ulong)(local_8b0 + local_650)) {
    uVar19 = 0xf;
    if (local_8b8 != &local_8a8) {
      uVar19 = local_8a8;
    }
    if (uVar19 < (ulong)(local_8b0 + local_650)) goto LAB_0019a722;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8b8,0,(char *)0x0,(ulong)local_658);
  }
  else {
LAB_0019a722:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_658,(ulong)local_8b8);
  }
  local_778 = &local_768;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_768 = *puVar12;
    lStack_760 = puVar5[3];
  }
  else {
    local_768 = *puVar12;
    local_778 = (ulong *)*puVar5;
  }
  local_770 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_778);
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_7c8 = *puVar12;
    lStack_7c0 = puVar5[3];
    local_7d8 = &local_7c8;
  }
  else {
    local_7c8 = *puVar12;
    local_7d8 = (ulong *)*puVar5;
  }
  local_7d0 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_8d8 = &local_8c8;
  std::__cxx11::string::_M_construct((ulong)&local_8d8,'\x06');
  uVar19 = 0xf;
  if (local_7d8 != &local_7c8) {
    uVar19 = local_7c8;
  }
  if (uVar19 < (ulong)(local_8d0 + local_7d0)) {
    uVar19 = 0xf;
    if (local_8d8 != &local_8c8) {
      uVar19 = local_8c8;
    }
    if (uVar19 < (ulong)(local_8d0 + local_7d0)) goto LAB_0019a85f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8d8,0,(char *)0x0,(ulong)local_7d8);
  }
  else {
LAB_0019a85f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7d8,(ulong)local_8d8);
  }
  local_6f8 = &local_6e8;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_6e8 = *puVar12;
    lStack_6e0 = puVar5[3];
  }
  else {
    local_6e8 = *puVar12;
    local_6f8 = (ulong *)*puVar5;
  }
  local_6f0 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_6f8);
  local_6d8 = &local_6c8;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_6c8 = *puVar12;
    lStack_6c0 = plVar4[3];
  }
  else {
    local_6c8 = *puVar12;
    local_6d8 = (ulong *)*plVar4;
  }
  local_6d0 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_250[0]);
  local_7b8 = &local_7a8;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_7a8 = *puVar12;
    lStack_7a0 = plVar4[3];
  }
  else {
    local_7a8 = *puVar12;
    local_7b8 = (ulong *)*plVar4;
  }
  local_7b0 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_7b8);
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_788 = *puVar12;
    lStack_780 = puVar5[3];
    local_798 = &local_788;
  }
  else {
    local_788 = *puVar12;
    local_798 = (ulong *)*puVar5;
  }
  local_790 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_898 = &local_888;
  std::__cxx11::string::_M_construct((ulong)&local_898,'\x06');
  uVar19 = 0xf;
  if (local_798 != &local_788) {
    uVar19 = local_788;
  }
  if (uVar19 < (ulong)(local_890 + local_790)) {
    uVar19 = 0xf;
    if (local_898 != &local_888) {
      uVar19 = local_888;
    }
    if (uVar19 < (ulong)(local_890 + local_790)) goto LAB_0019aa67;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_898,0,(char *)0x0,(ulong)local_798);
  }
  else {
LAB_0019aa67:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_798,(ulong)local_898);
  }
  local_698 = &local_688;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_688 = *puVar12;
    lStack_680 = puVar5[3];
  }
  else {
    local_688 = *puVar12;
    local_698 = (ulong *)*puVar5;
  }
  local_690 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_698);
  local_858 = &local_848;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_848 = *plVar4;
    lStack_840 = puVar5[3];
  }
  else {
    local_848 = *plVar4;
    local_858 = (long *)*puVar5;
  }
  local_850 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_858,(ulong)local_250[0]);
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_828 = *puVar12;
    lStack_820 = plVar4[3];
    local_838 = &local_828;
  }
  else {
    local_828 = *puVar12;
    local_838 = (ulong *)*plVar4;
  }
  local_830 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_838);
  paVar18 = &local_5b8.field_2;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_5b8.field_2._M_allocated_capacity = *puVar12;
    local_5b8.field_2._8_8_ = plVar4[3];
    local_5b8._M_dataplus._M_p = (pointer)paVar18;
  }
  else {
    local_5b8.field_2._M_allocated_capacity = *puVar12;
    local_5b8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_5b8._M_string_length = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_818 = &local_808;
  std::__cxx11::string::_M_construct((ulong)&local_818,'\t');
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar18) {
    uVar17 = local_5b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_810 + local_5b8._M_string_length) {
    uVar19 = 0xf;
    if (local_818 != &local_808) {
      uVar19 = local_808;
    }
    if (uVar19 < local_810 + local_5b8._M_string_length) goto LAB_0019ac83;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_818,0,(char *)0x0,(ulong)local_5b8._M_dataplus._M_p);
  }
  else {
LAB_0019ac83:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5b8,(ulong)local_818);
  }
  local_418 = &local_408;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_408 = *puVar1;
    uStack_400 = puVar5[3];
  }
  else {
    local_408 = *puVar1;
    local_418 = (undefined8 *)*puVar5;
  }
  local_410 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_418);
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_8e8 = *puVar12;
    lStack_8e0 = plVar4[3];
    local_8f8 = &local_8e8;
  }
  else {
    local_8e8 = *puVar12;
    local_8f8 = (ulong *)*plVar4;
  }
  local_8f0 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_7f8,vsnprintf,0x148,"%f",0x9999999a);
  uVar19 = 0xf;
  if (local_8f8 != &local_8e8) {
    uVar19 = local_8e8;
  }
  if (uVar19 < local_7f8._M_string_length + local_8f0) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
      uVar17 = local_7f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_7f8._M_string_length + local_8f0) goto LAB_0019adca;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_7f8,0,(char *)0x0,(ulong)local_8f8);
  }
  else {
LAB_0019adca:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_8f8,(ulong)local_7f8._M_dataplus._M_p);
  }
  local_230 = &local_220;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_220 = *plVar4;
    uStack_218 = puVar5[3];
  }
  else {
    local_220 = *plVar4;
    local_230 = (long *)*puVar5;
  }
  local_228 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_270 = &local_260;
  plVar13 = plVar4 + 2;
  if ((long *)*plVar4 == plVar13) {
    local_260 = *plVar13;
    lStack_258 = plVar4[3];
  }
  else {
    local_260 = *plVar13;
    local_270 = (long *)*plVar4;
  }
  local_268 = plVar4[1];
  *plVar4 = (long)plVar13;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p);
  }
  if (local_8f8 != &local_8e8) {
    operator_delete(local_8f8);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418);
  }
  if (local_818 != &local_808) {
    operator_delete(local_818);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar18) {
    operator_delete(local_5b8._M_dataplus._M_p);
  }
  if (local_838 != &local_828) {
    operator_delete(local_838);
  }
  if (local_858 != &local_848) {
    operator_delete(local_858);
  }
  if (local_698 != &local_688) {
    operator_delete(local_698);
  }
  if (local_898 != &local_888) {
    operator_delete(local_898);
  }
  if (local_798 != &local_788) {
    operator_delete(local_798);
  }
  if (local_7b8 != &local_7a8) {
    operator_delete(local_7b8);
  }
  if (local_6d8 != &local_6c8) {
    operator_delete(local_6d8);
  }
  if (local_6f8 != &local_6e8) {
    operator_delete(local_6f8);
  }
  if (local_8d8 != &local_8c8) {
    operator_delete(local_8d8);
  }
  if (local_7d8 != &local_7c8) {
    operator_delete(local_7d8);
  }
  if (local_778 != &local_768) {
    operator_delete(local_778);
  }
  if (local_8b8 != &local_8a8) {
    operator_delete(local_8b8);
  }
  if (local_658 != &local_648) {
    operator_delete(local_658);
  }
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8);
  }
  if (local_6b8 != &local_6a8) {
    operator_delete(local_6b8);
  }
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  if (local_598 != &local_588) {
    operator_delete(local_598);
  }
  local_8f8 = &local_8e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f8,"");
  local_418 = &local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
  uVar19 = 0;
  local_3f8 = this;
  while( true ) {
    paVar18 = &local_5b8.field_2;
    sVar6 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar6 <= uVar19) break;
    pAVar7 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar19);
    if ((((this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[uVar19 >> 6] >>
          (uVar19 & 0x3f) & 1) == 0) ||
       (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[uVar19 >> 6] &
        1L << ((byte)uVar19 & 0x3f)) != 0)) {
      local_858 = &local_848;
      std::__cxx11::string::_M_construct((ulong)&local_858,'\x06');
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_858);
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_828 = *puVar12;
        lStack_820 = puVar5[3];
        local_838 = &local_828;
      }
      else {
        local_828 = *puVar12;
        local_838 = (ulong *)*puVar5;
      }
      local_830 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_838,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      this = local_3f8;
      puVar12 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_5b8.field_2._M_allocated_capacity = *puVar12;
        local_5b8.field_2._8_8_ = puVar5[3];
        local_5b8._M_dataplus._M_p = (pointer)paVar18;
      }
      else {
        local_5b8.field_2._M_allocated_capacity = *puVar12;
        local_5b8._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_5b8._M_string_length = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_5b8);
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_220 = *plVar4;
        uStack_218 = puVar5[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *plVar4;
        local_230 = (long *)*puVar5;
      }
      local_228 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_8f8,(ulong)local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar18) {
        operator_delete(local_5b8._M_dataplus._M_p);
      }
      if (local_838 != &local_828) {
        operator_delete(local_838);
      }
      plVar4 = local_858;
      if (local_858 != &local_848) goto LAB_0019b2fd;
    }
    else {
      puVar12 = *(ulong **)
                 &((*(this->varToQuery[uVar19]->_aggregates).
                     super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                     super__Vector_impl_data._M_start)->_incoming).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data;
      uVar11 = *puVar12;
      cVar16 = '\x01';
      if (9 < uVar11) {
        uVar14 = uVar11;
        cVar3 = '\x04';
        do {
          cVar16 = cVar3;
          if (uVar14 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_0019b385;
          }
          if (uVar14 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_0019b385;
          }
          if (uVar14 < 10000) goto LAB_0019b385;
          bVar2 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar3 = cVar16 + '\x04';
        } while (bVar2);
        cVar16 = cVar16 + '\x01';
      }
LAB_0019b385:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_5b8,cVar16);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_5b8._M_dataplus._M_p,(uint)local_5b8._M_string_length,uVar11);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_5b8,0,(char *)0x0,0x2a8219)
      ;
      local_230 = &local_220;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_220 = *plVar4;
        uStack_218 = puVar5[3];
      }
      else {
        local_220 = *plVar4;
        local_230 = (long *)*puVar5;
      }
      local_228 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p);
      }
      this_00 = local_3f8;
      pAVar8 = TreeDecomposition::getAttribute
                         ((local_3f8->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar19);
      Application::typeToStr_abi_cxx11_(&local_5b8,&this_00->super_Application,pAVar8->_type);
      local_438 = local_428;
      std::__cxx11::string::_M_construct((ulong)&local_438,'\x06');
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_438);
      local_4d8 = &local_4c8;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_4c8 = *puVar10;
        lStack_4c0 = plVar4[3];
      }
      else {
        local_4c8 = *puVar10;
        local_4d8 = (ulong *)*plVar4;
      }
      local_4d0 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_290 = local_280;
      std::__cxx11::string::_M_construct((ulong)&local_290,'\x06');
      uVar11 = 0xf;
      if (local_4d8 != &local_4c8) {
        uVar11 = local_4c8;
      }
      if (uVar11 < (ulong)(local_288 + local_4d0)) {
        uVar11 = 0xf;
        if (local_290 != local_280) {
          uVar11 = local_280[0];
        }
        if (uVar11 < (ulong)(local_288 + local_4d0)) goto LAB_0019b587;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_4d8);
      }
      else {
LAB_0019b587:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_290);
      }
      local_4b8 = &local_4a8;
      puVar10 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar10) {
        local_4a8 = *puVar10;
        uStack_4a0 = puVar5[3];
      }
      else {
        local_4a8 = *puVar10;
        local_4b8 = (ulong *)*puVar5;
      }
      local_4b0 = puVar5[1];
      *puVar5 = puVar10;
      puVar5[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_4b8,(ulong)local_5b8._M_dataplus._M_p);
      local_478 = &local_468;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_468 = *puVar10;
        lStack_460 = plVar4[3];
      }
      else {
        local_468 = *puVar10;
        local_478 = (ulong *)*plVar4;
      }
      local_470 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_478);
      local_458 = &local_448;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_448 = *puVar10;
        lStack_440 = plVar4[3];
      }
      else {
        local_448 = *puVar10;
        local_458 = (ulong *)*plVar4;
      }
      local_450 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_458,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_498 = &local_488;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_488 = *puVar10;
        lStack_480 = plVar4[3];
      }
      else {
        local_488 = *puVar10;
        local_498 = (ulong *)*plVar4;
      }
      local_490 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_498);
      local_4f8 = &local_4e8;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_4e8 = *puVar10;
        lStack_4e0 = plVar4[3];
      }
      else {
        local_4e8 = *puVar10;
        local_4f8 = (ulong *)*plVar4;
      }
      local_4f0 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_3d0 = local_3c0;
      std::__cxx11::string::_M_construct((ulong)&local_3d0,'\x02');
      *(undefined2 *)local_3d0 = 0x3931;
      uVar11 = 0xf;
      if (local_4f8 != &local_4e8) {
        uVar11 = local_4e8;
      }
      if (uVar11 < (ulong)(local_3c8 + local_4f0)) {
        uVar11 = 0xf;
        if (local_3d0 != local_3c0) {
          uVar11 = local_3c0[0];
        }
        if (uVar11 < (ulong)(local_3c8 + local_4f0)) goto LAB_0019b844;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,(ulong)local_4f8);
      }
      else {
LAB_0019b844:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4f8,(ulong)local_3d0);
      }
      local_578 = &local_568;
      puVar10 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar10) {
        local_568 = *puVar10;
        uStack_560 = puVar5[3];
      }
      else {
        local_568 = *puVar10;
        local_578 = (ulong *)*puVar5;
      }
      local_570 = puVar5[1];
      *puVar5 = puVar10;
      puVar5[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_578);
      local_518 = &local_508;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_508 = *puVar10;
        lStack_500 = plVar4[3];
      }
      else {
        local_508 = *puVar10;
        local_518 = (ulong *)*plVar4;
      }
      local_510 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_2b0 = local_2a0;
      std::__cxx11::string::_M_construct((ulong)&local_2b0,'\x06');
      uVar11 = 0xf;
      if (local_518 != &local_508) {
        uVar11 = local_508;
      }
      if (uVar11 < (ulong)(local_2a8 + local_510)) {
        uVar11 = 0xf;
        if (local_2b0 != local_2a0) {
          uVar11 = local_2a0[0];
        }
        if (uVar11 < (ulong)(local_2a8 + local_510)) goto LAB_0019b9b2;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_518);
      }
      else {
LAB_0019b9b2:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_2b0);
      }
      local_678 = &local_668;
      puVar10 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar10) {
        local_668 = *puVar10;
        uStack_660 = puVar5[3];
      }
      else {
        local_668 = *puVar10;
        local_678 = (ulong *)*puVar5;
      }
      local_670 = puVar5[1];
      *puVar5 = puVar10;
      puVar5[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_678);
      local_558 = &local_548;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_548 = *puVar10;
        lStack_540 = plVar4[3];
      }
      else {
        local_548 = *puVar10;
        local_558 = (ulong *)*plVar4;
      }
      local_550 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_558,(ulong)local_230);
      local_638 = &local_628;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_628 = *puVar10;
        lStack_620 = plVar4[3];
      }
      else {
        local_628 = *puVar10;
        local_638 = (ulong *)*plVar4;
      }
      local_630 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_638);
      local_878 = &local_868;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_868 = *puVar10;
        lStack_860 = plVar4[3];
      }
      else {
        local_868 = *puVar10;
        local_878 = (ulong *)*plVar4;
      }
      local_870 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_878,(ulong)local_230);
      local_758 = &local_748;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_748 = *puVar10;
        lStack_740 = plVar4[3];
      }
      else {
        local_748 = *puVar10;
        local_758 = (ulong *)*plVar4;
      }
      local_750 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_758);
      local_718 = &local_708;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_708 = *puVar10;
        lStack_700 = plVar4[3];
      }
      else {
        local_708 = *puVar10;
        local_718 = (ulong *)*plVar4;
      }
      local_710 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_2d0 = local_2c0;
      std::__cxx11::string::_M_construct((ulong)&local_2d0,'\x06');
      uVar11 = 0xf;
      if (local_718 != &local_708) {
        uVar11 = local_708;
      }
      if (uVar11 < (ulong)(local_2c8 + local_710)) {
        uVar11 = 0xf;
        if (local_2d0 != local_2c0) {
          uVar11 = local_2c0[0];
        }
        if (uVar11 < (ulong)(local_2c8 + local_710)) goto LAB_0019bcd6;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_718);
      }
      else {
LAB_0019bcd6:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_718,(ulong)local_2d0);
      }
      local_618 = &local_608;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_608 = *plVar4;
        lStack_600 = puVar5[3];
      }
      else {
        local_608 = *plVar4;
        local_618 = (long *)*puVar5;
      }
      local_610 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_618);
      local_538 = &local_528;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_528 = *puVar10;
        lStack_520 = plVar4[3];
      }
      else {
        local_528 = *puVar10;
        local_538 = (ulong *)*plVar4;
      }
      local_530 = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_2f0 = local_2e0;
      std::__cxx11::string::_M_construct((ulong)&local_2f0,'\t');
      uVar11 = 0xf;
      if (local_538 != &local_528) {
        uVar11 = local_528;
      }
      if (uVar11 < (ulong)(local_2e8 + local_530)) {
        uVar11 = 0xf;
        if (local_2f0 != local_2e0) {
          uVar11 = local_2e0[0];
        }
        if (uVar11 < (ulong)(local_2e8 + local_530)) goto LAB_0019be44;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_538);
      }
      else {
LAB_0019be44:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_538,(ulong)local_2f0);
      }
      local_5f8 = &local_5e8;
      puVar10 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar10) {
        local_5e8 = *puVar10;
        lStack_5e0 = puVar5[3];
      }
      else {
        local_5e8 = *puVar10;
        local_5f8 = (ulong *)*puVar5;
      }
      local_5f0 = puVar5[1];
      *puVar5 = puVar10;
      puVar5[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_5f8);
      local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
      puVar10 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_7f8.field_2._M_allocated_capacity = *puVar10;
        local_7f8.field_2._8_8_ = plVar4[3];
      }
      else {
        local_7f8.field_2._M_allocated_capacity = *puVar10;
        local_7f8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_7f8._M_string_length = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar11 = puVar12[1];
      cVar16 = '\x01';
      if (9 < uVar11) {
        uVar14 = uVar11;
        cVar3 = '\x04';
        do {
          cVar16 = cVar3;
          if (uVar14 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_0019bf92;
          }
          if (uVar14 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_0019bf92;
          }
          if (uVar14 < 10000) goto LAB_0019bf92;
          bVar2 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar3 = cVar16 + '\x04';
        } while (bVar2);
        cVar16 = cVar16 + '\x01';
      }
LAB_0019bf92:
      local_3f0 = local_3e0;
      std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar16);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_3f0,local_3e8,uVar11);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
        uVar17 = local_7f8.field_2._M_allocated_capacity;
      }
      uVar11 = CONCAT44(uStack_3e4,local_3e8) + local_7f8._M_string_length;
      if ((ulong)uVar17 < uVar11) {
        uVar14 = 0xf;
        if (local_3f0 != local_3e0) {
          uVar14 = local_3e0[0];
        }
        if (uVar14 < uVar11) goto LAB_0019c031;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_3f0,0,(char *)0x0,(ulong)local_7f8._M_dataplus._M_p);
      }
      else {
LAB_0019c031:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7f8,(ulong)local_3f0);
      }
      local_818 = &local_808;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_808 = *puVar12;
        lStack_800 = puVar5[3];
      }
      else {
        local_808 = *puVar12;
        local_818 = (ulong *)*puVar5;
      }
      local_810 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_818);
      local_898 = &local_888;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_888 = *puVar12;
        lStack_880 = plVar4[3];
      }
      else {
        local_888 = *puVar12;
        local_898 = (ulong *)*plVar4;
      }
      local_890 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_310 = local_300;
      std::__cxx11::string::_M_construct((ulong)&local_310,'\t');
      uVar11 = 0xf;
      if (local_898 != &local_888) {
        uVar11 = local_888;
      }
      if (uVar11 < (ulong)(local_308 + local_890)) {
        uVar11 = 0xf;
        if (local_310 != local_300) {
          uVar11 = local_300[0];
        }
        if (uVar11 < (ulong)(local_308 + local_890)) goto LAB_0019c184;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_898);
      }
      else {
LAB_0019c184:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_898,(ulong)local_310);
      }
      local_8d8 = &local_8c8;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_8c8 = *puVar12;
        lStack_8c0 = puVar5[3];
      }
      else {
        local_8c8 = *puVar12;
        local_8d8 = (ulong *)*puVar5;
      }
      local_8d0 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_8d8);
      local_8b8 = &local_8a8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_8a8 = *puVar12;
        lStack_8a0 = plVar4[3];
      }
      else {
        local_8a8 = *puVar12;
        local_8b8 = (ulong *)*plVar4;
      }
      local_8b0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_330 = local_320;
      std::__cxx11::string::_M_construct((ulong)&local_330,'\t');
      uVar11 = 0xf;
      if (local_8b8 != &local_8a8) {
        uVar11 = local_8a8;
      }
      if (uVar11 < (ulong)(local_328 + local_8b0)) {
        uVar11 = 0xf;
        if (local_330 != local_320) {
          uVar11 = local_320[0];
        }
        if (uVar11 < (ulong)(local_328 + local_8b0)) goto LAB_0019c2c2;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,(ulong)local_8b8);
      }
      else {
LAB_0019c2c2:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8b8,(ulong)local_330);
      }
      local_6b8 = &local_6a8;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_6a8 = *puVar12;
        lStack_6a0 = puVar5[3];
      }
      else {
        local_6a8 = *puVar12;
        local_6b8 = (ulong *)*puVar5;
      }
      local_6b0 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_6b8);
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_588 = *puVar12;
        lStack_580 = plVar4[3];
        local_598 = &local_588;
      }
      else {
        local_588 = *puVar12;
        local_598 = (ulong *)*plVar4;
      }
      local_590 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_350 = local_340;
      std::__cxx11::string::_M_construct((ulong)&local_350,'\f');
      uVar11 = 0xf;
      if (local_598 != &local_588) {
        uVar11 = local_588;
      }
      if (uVar11 < (ulong)(local_348 + local_590)) {
        uVar11 = 0xf;
        if (local_350 != local_340) {
          uVar11 = local_340[0];
        }
        if (uVar11 < (ulong)(local_348 + local_590)) goto LAB_0019c41e;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,(ulong)local_598);
      }
      else {
LAB_0019c41e:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_598,(ulong)local_350);
      }
      local_738 = &local_728;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_728 = *puVar12;
        lStack_720 = puVar5[3];
      }
      else {
        local_728 = *puVar12;
        local_738 = (ulong *)*puVar5;
      }
      local_730 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_738);
      local_5d8 = &local_5c8;
      plVar13 = plVar4 + 2;
      if ((long *)*plVar4 == plVar13) {
        local_5c8 = *plVar13;
        lStack_5c0 = plVar4[3];
      }
      else {
        local_5c8 = *plVar13;
        local_5d8 = (long *)*plVar4;
      }
      local_5d0 = plVar4[1];
      *plVar4 = (long)plVar13;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_5d8,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_658 = &local_648;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_648 = *puVar12;
        lStack_640 = plVar4[3];
      }
      else {
        local_648 = *puVar12;
        local_658 = (ulong *)*plVar4;
      }
      local_650 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_658);
      local_778 = &local_768;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_768 = *puVar12;
        lStack_760 = plVar4[3];
      }
      else {
        local_768 = *puVar12;
        local_778 = (ulong *)*plVar4;
      }
      local_770 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_778,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_7d8 = &local_7c8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_7c8 = *puVar12;
        lStack_7c0 = plVar4[3];
      }
      else {
        local_7c8 = *puVar12;
        local_7d8 = (ulong *)*plVar4;
      }
      local_7d0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_7d8);
      local_6f8 = &local_6e8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_6e8 = *puVar12;
        lStack_6e0 = plVar4[3];
      }
      else {
        local_6e8 = *puVar12;
        local_6f8 = (ulong *)*plVar4;
      }
      local_6f0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_370 = local_360;
      std::__cxx11::string::_M_construct((ulong)&local_370,'\f');
      uVar11 = 0xf;
      if (local_6f8 != &local_6e8) {
        uVar11 = local_6e8;
      }
      if (uVar11 < (ulong)(local_368 + local_6f0)) {
        uVar11 = 0xf;
        if (local_370 != local_360) {
          uVar11 = local_360[0];
        }
        if (uVar11 < (ulong)(local_368 + local_6f0)) goto LAB_0019c732;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,(ulong)local_6f8);
      }
      else {
LAB_0019c732:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6f8,(ulong)local_370);
      }
      local_6d8 = &local_6c8;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_6c8 = *puVar12;
        lStack_6c0 = puVar5[3];
      }
      else {
        local_6c8 = *puVar12;
        local_6d8 = (ulong *)*puVar5;
      }
      local_6d0 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_6d8);
      local_7b8 = &local_7a8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_7a8 = *puVar12;
        lStack_7a0 = plVar4[3];
      }
      else {
        local_7a8 = *puVar12;
        local_7b8 = (ulong *)*plVar4;
      }
      local_7b0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_390 = local_380;
      std::__cxx11::string::_M_construct((ulong)&local_390,'\t');
      uVar11 = 0xf;
      if (local_7b8 != &local_7a8) {
        uVar11 = local_7a8;
      }
      if (uVar11 < (ulong)(local_388 + local_7b0)) {
        uVar11 = 0xf;
        if (local_390 != local_380) {
          uVar11 = local_380[0];
        }
        if (uVar11 < (ulong)(local_388 + local_7b0)) goto LAB_0019c8a0;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,(ulong)local_7b8);
      }
      else {
LAB_0019c8a0:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7b8,(ulong)local_390);
      }
      local_798 = &local_788;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_788 = *puVar12;
        lStack_780 = puVar5[3];
      }
      else {
        local_788 = *puVar12;
        local_798 = (ulong *)*puVar5;
      }
      local_790 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_798);
      local_698 = &local_688;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_688 = *puVar12;
        lStack_680 = plVar4[3];
      }
      else {
        local_688 = *puVar12;
        local_698 = (ulong *)*plVar4;
      }
      local_690 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_3b0 = local_3a0;
      std::__cxx11::string::_M_construct((ulong)&local_3b0,'\x06');
      uVar11 = 0xf;
      if (local_698 != &local_688) {
        uVar11 = local_688;
      }
      if (uVar11 < (ulong)(local_3a8 + local_690)) {
        uVar11 = 0xf;
        if (local_3b0 != local_3a0) {
          uVar11 = local_3a0[0];
        }
        if (uVar11 < (ulong)(local_3a8 + local_690)) goto LAB_0019ca0e;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)local_698);
      }
      else {
LAB_0019ca0e:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_698,(ulong)local_3b0);
      }
      local_858 = &local_848;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_848 = *plVar4;
        lStack_840 = puVar5[3];
      }
      else {
        local_848 = *plVar4;
        local_858 = (long *)*puVar5;
      }
      local_850 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_858);
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_828 = *puVar12;
        lStack_820 = puVar5[3];
        local_838 = &local_828;
      }
      else {
        local_828 = *puVar12;
        local_838 = (ulong *)*puVar5;
      }
      local_830 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_838);
      if (local_838 != &local_828) {
        operator_delete(local_838);
      }
      if (local_858 != &local_848) {
        operator_delete(local_858);
      }
      if (local_3b0 != local_3a0) {
        operator_delete(local_3b0);
      }
      if (local_698 != &local_688) {
        operator_delete(local_698);
      }
      if (local_798 != &local_788) {
        operator_delete(local_798);
      }
      if (local_390 != local_380) {
        operator_delete(local_390);
      }
      if (local_7b8 != &local_7a8) {
        operator_delete(local_7b8);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8);
      }
      if (local_370 != local_360) {
        operator_delete(local_370);
      }
      if (local_6f8 != &local_6e8) {
        operator_delete(local_6f8);
      }
      if (local_7d8 != &local_7c8) {
        operator_delete(local_7d8);
      }
      if (local_778 != &local_768) {
        operator_delete(local_778);
      }
      if (local_658 != &local_648) {
        operator_delete(local_658);
      }
      if (local_5d8 != &local_5c8) {
        operator_delete(local_5d8);
      }
      if (local_738 != &local_728) {
        operator_delete(local_738);
      }
      if (local_350 != local_340) {
        operator_delete(local_350);
      }
      if (local_598 != &local_588) {
        operator_delete(local_598);
      }
      if (local_6b8 != &local_6a8) {
        operator_delete(local_6b8);
      }
      if (local_330 != local_320) {
        operator_delete(local_330);
      }
      if (local_8b8 != &local_8a8) {
        operator_delete(local_8b8);
      }
      if (local_8d8 != &local_8c8) {
        operator_delete(local_8d8);
      }
      if (local_310 != local_300) {
        operator_delete(local_310);
      }
      if (local_898 != &local_888) {
        operator_delete(local_898);
      }
      if (local_818 != &local_808) {
        operator_delete(local_818);
      }
      if (local_3f0 != local_3e0) {
        operator_delete(local_3f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
        operator_delete(local_7f8._M_dataplus._M_p);
      }
      if (local_5f8 != &local_5e8) {
        operator_delete(local_5f8);
      }
      if (local_2f0 != local_2e0) {
        operator_delete(local_2f0);
      }
      if (local_538 != &local_528) {
        operator_delete(local_538);
      }
      if (local_618 != &local_608) {
        operator_delete(local_618);
      }
      if (local_2d0 != local_2c0) {
        operator_delete(local_2d0);
      }
      if (local_718 != &local_708) {
        operator_delete(local_718);
      }
      if (local_758 != &local_748) {
        operator_delete(local_758);
      }
      if (local_878 != &local_868) {
        operator_delete(local_878);
      }
      if (local_638 != &local_628) {
        operator_delete(local_638);
      }
      if (local_558 != &local_548) {
        operator_delete(local_558);
      }
      if (local_678 != &local_668) {
        operator_delete(local_678);
      }
      if (local_2b0 != local_2a0) {
        operator_delete(local_2b0);
      }
      if (local_518 != &local_508) {
        operator_delete(local_518);
      }
      if (local_578 != &local_568) {
        operator_delete(local_578);
      }
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0);
      }
      if (local_4f8 != &local_4e8) {
        operator_delete(local_4f8);
      }
      if (local_498 != &local_488) {
        operator_delete(local_498);
      }
      if (local_458 != &local_448) {
        operator_delete(local_458);
      }
      if (local_478 != &local_468) {
        operator_delete(local_478);
      }
      if (local_4b8 != &local_4a8) {
        operator_delete(local_4b8);
      }
      if (local_290 != local_280) {
        operator_delete(local_290);
      }
      if (local_4d8 != &local_4c8) {
        operator_delete(local_4d8);
      }
      if (local_438 != local_428) {
        operator_delete(local_438);
      }
      local_718 = &local_708;
      std::__cxx11::string::_M_construct((ulong)&local_718,'\x06');
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_718);
      local_618 = &local_608;
      plVar13 = plVar4 + 2;
      if ((long *)*plVar4 == plVar13) {
        local_608 = *plVar13;
        lStack_600 = plVar4[3];
      }
      else {
        local_608 = *plVar13;
        local_618 = (long *)*plVar4;
      }
      local_610 = plVar4[1];
      *plVar4 = (long)plVar13;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_618,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_538 = &local_528;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_528 = *puVar12;
        lStack_520 = plVar4[3];
      }
      else {
        local_528 = *puVar12;
        local_538 = (ulong *)*plVar4;
      }
      local_530 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_538);
      local_5f8 = &local_5e8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_5e8 = *puVar12;
        lStack_5e0 = plVar4[3];
      }
      else {
        local_5e8 = *puVar12;
        local_5f8 = (ulong *)*plVar4;
      }
      local_5f0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_758 = &local_748;
      std::__cxx11::string::_M_construct((ulong)&local_758,'\x06');
      uVar11 = 0xf;
      if (local_5f8 != &local_5e8) {
        uVar11 = local_5e8;
      }
      if (uVar11 < (ulong)(local_750 + local_5f0)) {
        uVar11 = 0xf;
        if (local_758 != &local_748) {
          uVar11 = local_748;
        }
        if (uVar11 < (ulong)(local_750 + local_5f0)) goto LAB_0019d1cc;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_758,0,(char *)0x0,(ulong)local_5f8);
      }
      else {
LAB_0019d1cc:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_758);
      }
      local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
      psVar15 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_7f8.field_2._M_allocated_capacity = *psVar15;
        local_7f8.field_2._8_8_ = puVar5[3];
      }
      else {
        local_7f8.field_2._M_allocated_capacity = *psVar15;
        local_7f8._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_7f8._M_string_length = puVar5[1];
      *puVar5 = psVar15;
      puVar5[1] = 0;
      *(undefined1 *)psVar15 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_7f8);
      local_818 = &local_808;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_808 = *puVar12;
        lStack_800 = plVar4[3];
      }
      else {
        local_808 = *puVar12;
        local_818 = (ulong *)*plVar4;
      }
      local_810 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_878 = &local_868;
      std::__cxx11::string::_M_construct((ulong)&local_878,'\x02');
      *(undefined2 *)local_878 = 0x3931;
      uVar11 = 0xf;
      if (local_818 != &local_808) {
        uVar11 = local_808;
      }
      if (uVar11 < (ulong)(local_870 + local_810)) {
        uVar11 = 0xf;
        if (local_878 != &local_868) {
          uVar11 = local_868;
        }
        if (uVar11 < (ulong)(local_870 + local_810)) goto LAB_0019d344;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_878,0,(char *)0x0,(ulong)local_818);
      }
      else {
LAB_0019d344:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_818,(ulong)local_878);
      }
      local_898 = &local_888;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_888 = *puVar12;
        lStack_880 = puVar5[3];
      }
      else {
        local_888 = *puVar12;
        local_898 = (ulong *)*puVar5;
      }
      local_890 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_898);
      local_8d8 = &local_8c8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_8c8 = *puVar12;
        lStack_8c0 = plVar4[3];
      }
      else {
        local_8c8 = *puVar12;
        local_8d8 = (ulong *)*plVar4;
      }
      local_8d0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_638 = &local_628;
      std::__cxx11::string::_M_construct((ulong)&local_638,'\t');
      uVar11 = 0xf;
      if (local_8d8 != &local_8c8) {
        uVar11 = local_8c8;
      }
      if (uVar11 < (ulong)(local_630 + local_8d0)) {
        uVar11 = 0xf;
        if (local_638 != &local_628) {
          uVar11 = local_628;
        }
        if (uVar11 < (ulong)(local_630 + local_8d0)) goto LAB_0019d485;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_638,0,(char *)0x0,(ulong)local_8d8);
      }
      else {
LAB_0019d485:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8d8,(ulong)local_638);
      }
      local_8b8 = &local_8a8;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_8a8 = *puVar12;
        lStack_8a0 = puVar5[3];
      }
      else {
        local_8a8 = *puVar12;
        local_8b8 = (ulong *)*puVar5;
      }
      local_8b0 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_8b8);
      local_6b8 = &local_6a8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_6a8 = *puVar12;
        lStack_6a0 = plVar4[3];
      }
      else {
        local_6a8 = *puVar12;
        local_6b8 = (ulong *)*plVar4;
      }
      local_6b0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_6b8,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_588 = *puVar12;
        lStack_580 = plVar4[3];
        local_598 = &local_588;
      }
      else {
        local_588 = *puVar12;
        local_598 = (ulong *)*plVar4;
      }
      local_590 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_598);
      local_738 = &local_728;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_728 = *puVar12;
        lStack_720 = plVar4[3];
      }
      else {
        local_728 = *puVar12;
        local_738 = (ulong *)*plVar4;
      }
      local_730 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_738);
      local_5d8 = &local_5c8;
      plVar13 = plVar4 + 2;
      if ((long *)*plVar4 == plVar13) {
        local_5c8 = *plVar13;
        lStack_5c0 = plVar4[3];
      }
      else {
        local_5c8 = *plVar13;
        local_5d8 = (long *)*plVar4;
      }
      local_5d0 = plVar4[1];
      *plVar4 = (long)plVar13;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_5d8,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_658 = &local_648;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_648 = *puVar12;
        lStack_640 = plVar4[3];
      }
      else {
        local_648 = *puVar12;
        local_658 = (ulong *)*plVar4;
      }
      local_650 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_658);
      local_778 = &local_768;
      puVar12 = (ulong *)(plVar4 + 2);
      local_558 = &local_548;
      if ((ulong *)*plVar4 == puVar12) {
        local_768 = *puVar12;
        lStack_760 = plVar4[3];
      }
      else {
        local_768 = *puVar12;
        local_778 = (ulong *)*plVar4;
      }
      local_770 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_construct((ulong)&local_558,'\f');
      uVar11 = 0xf;
      if (local_778 != &local_768) {
        uVar11 = local_768;
      }
      if (uVar11 < (ulong)(local_550 + local_770)) {
        uVar11 = 0xf;
        if (local_558 != &local_548) {
          uVar11 = local_548;
        }
        if (uVar11 < (ulong)(local_550 + local_770)) goto LAB_0019d7e6;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,(ulong)local_778);
      }
      else {
LAB_0019d7e6:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_778,(ulong)local_558);
      }
      local_7d8 = &local_7c8;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_7c8 = *puVar12;
        lStack_7c0 = puVar5[3];
      }
      else {
        local_7c8 = *puVar12;
        local_7d8 = (ulong *)*puVar5;
      }
      local_7d0 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_7d8);
      local_6f8 = &local_6e8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_6e8 = *puVar12;
        lStack_6e0 = plVar4[3];
      }
      else {
        local_6e8 = *puVar12;
        local_6f8 = (ulong *)*plVar4;
      }
      local_6f0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_6f8,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_6d8 = &local_6c8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_6c8 = *puVar12;
        lStack_6c0 = plVar4[3];
      }
      else {
        local_6c8 = *puVar12;
        local_6d8 = (ulong *)*plVar4;
      }
      local_6d0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_6d8);
      local_7b8 = &local_7a8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_7a8 = *puVar12;
        lStack_7a0 = plVar4[3];
      }
      else {
        local_7a8 = *puVar12;
        local_7b8 = (ulong *)*plVar4;
      }
      local_7b0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_678 = &local_668;
      std::__cxx11::string::_M_construct((ulong)&local_678,'\x06');
      uVar11 = 0xf;
      if (local_7b8 != &local_7a8) {
        uVar11 = local_7a8;
      }
      if (uVar11 < (ulong)(local_670 + local_7b0)) {
        uVar11 = 0xf;
        if (local_678 != &local_668) {
          uVar11 = local_668;
        }
        if (uVar11 < (ulong)(local_670 + local_7b0)) goto LAB_0019da27;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_678,0,(char *)0x0,(ulong)local_7b8);
      }
      else {
LAB_0019da27:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7b8,(ulong)local_678);
      }
      local_798 = &local_788;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_788 = *puVar12;
        lStack_780 = puVar5[3];
      }
      else {
        local_788 = *puVar12;
        local_798 = (ulong *)*puVar5;
      }
      local_790 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_798);
      local_698 = &local_688;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_688 = *puVar12;
        lStack_680 = plVar4[3];
      }
      else {
        local_688 = *puVar12;
        local_698 = (ulong *)*plVar4;
      }
      local_690 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_698,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_858 = &local_848;
      plVar13 = plVar4 + 2;
      if ((long *)*plVar4 == plVar13) {
        local_848 = *plVar13;
        lStack_840 = plVar4[3];
      }
      else {
        local_848 = *plVar13;
        local_858 = (long *)*plVar4;
      }
      local_850 = plVar4[1];
      *plVar4 = (long)plVar13;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_858);
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_828 = *puVar12;
        lStack_820 = puVar5[3];
        local_838 = &local_828;
      }
      else {
        local_828 = *puVar12;
        local_838 = (ulong *)*puVar5;
      }
      local_830 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_8f8,(ulong)local_838);
      if (local_838 != &local_828) {
        operator_delete(local_838);
      }
      if (local_858 != &local_848) {
        operator_delete(local_858);
      }
      if (local_698 != &local_688) {
        operator_delete(local_698);
      }
      if (local_798 != &local_788) {
        operator_delete(local_798);
      }
      if (local_678 != &local_668) {
        operator_delete(local_678);
      }
      if (local_7b8 != &local_7a8) {
        operator_delete(local_7b8);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8);
      }
      if (local_6f8 != &local_6e8) {
        operator_delete(local_6f8);
      }
      if (local_7d8 != &local_7c8) {
        operator_delete(local_7d8);
      }
      if (local_558 != &local_548) {
        operator_delete(local_558);
      }
      if (local_778 != &local_768) {
        operator_delete(local_778);
      }
      if (local_658 != &local_648) {
        operator_delete(local_658);
      }
      if (local_5d8 != &local_5c8) {
        operator_delete(local_5d8);
      }
      if (local_738 != &local_728) {
        operator_delete(local_738);
      }
      if (local_598 != &local_588) {
        operator_delete(local_598);
      }
      if (local_6b8 != &local_6a8) {
        operator_delete(local_6b8);
      }
      if (local_8b8 != &local_8a8) {
        operator_delete(local_8b8);
      }
      if (local_638 != &local_628) {
        operator_delete(local_638);
      }
      if (local_8d8 != &local_8c8) {
        operator_delete(local_8d8);
      }
      if (local_898 != &local_888) {
        operator_delete(local_898);
      }
      if (local_878 != &local_868) {
        operator_delete(local_878);
      }
      if (local_818 != &local_808) {
        operator_delete(local_818);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
        operator_delete(local_7f8._M_dataplus._M_p);
      }
      if (local_758 != &local_748) {
        operator_delete(local_758);
      }
      if (local_5f8 != &local_5e8) {
        operator_delete(local_5f8);
      }
      if (local_538 != &local_528) {
        operator_delete(local_538);
      }
      if (local_618 != &local_608) {
        operator_delete(local_618);
      }
      if (local_718 != &local_708) {
        operator_delete(local_718);
      }
      local_878 = &local_868;
      std::__cxx11::string::_M_construct((ulong)&local_878,'\x06');
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_878);
      local_758 = &local_748;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_748 = *puVar12;
        lStack_740 = plVar4[3];
      }
      else {
        local_748 = *puVar12;
        local_758 = (ulong *)*plVar4;
      }
      local_750 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_758,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_718 = &local_708;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_708 = *puVar12;
        lStack_700 = plVar4[3];
      }
      else {
        local_708 = *puVar12;
        local_718 = (ulong *)*plVar4;
      }
      local_710 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_718);
      local_618 = &local_608;
      plVar13 = plVar4 + 2;
      if ((long *)*plVar4 == plVar13) {
        local_608 = *plVar13;
        lStack_600 = plVar4[3];
      }
      else {
        local_608 = *plVar13;
        local_618 = (long *)*plVar4;
      }
      local_610 = plVar4[1];
      *plVar4 = (long)plVar13;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_618,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_538 = &local_528;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_528 = *puVar12;
        lStack_520 = plVar4[3];
      }
      else {
        local_528 = *puVar12;
        local_538 = (ulong *)*plVar4;
      }
      local_530 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_538);
      local_5f8 = &local_5e8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_5e8 = *puVar12;
        lStack_5e0 = plVar4[3];
      }
      else {
        local_5e8 = *puVar12;
        local_5f8 = (ulong *)*plVar4;
      }
      local_5f0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_638 = &local_628;
      std::__cxx11::string::_M_construct((ulong)&local_638,'\x06');
      uVar11 = 0xf;
      if (local_5f8 != &local_5e8) {
        uVar11 = local_5e8;
      }
      if (uVar11 < (ulong)(local_630 + local_5f0)) {
        uVar11 = 0xf;
        if (local_638 != &local_628) {
          uVar11 = local_628;
        }
        if (uVar11 < (ulong)(local_630 + local_5f0)) goto LAB_0019e164;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_638,0,(char *)0x0,(ulong)local_5f8);
      }
      else {
LAB_0019e164:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_638);
      }
      local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
      puVar12 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_7f8.field_2._M_allocated_capacity = *puVar12;
        local_7f8.field_2._8_8_ = puVar5[3];
      }
      else {
        local_7f8.field_2._M_allocated_capacity = *puVar12;
        local_7f8._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_7f8._M_string_length = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_7f8);
      local_818 = &local_808;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_808 = *puVar12;
        lStack_800 = plVar4[3];
      }
      else {
        local_808 = *puVar12;
        local_818 = (ulong *)*plVar4;
      }
      local_810 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_558 = &local_548;
      std::__cxx11::string::_M_construct((ulong)&local_558,'\x02');
      *(undefined2 *)local_558 = 0x3931;
      uVar11 = 0xf;
      if (local_818 != &local_808) {
        uVar11 = local_808;
      }
      if (uVar11 < (ulong)(local_550 + local_810)) {
        uVar11 = 0xf;
        if (local_558 != &local_548) {
          uVar11 = local_548;
        }
        if (uVar11 < (ulong)(local_550 + local_810)) goto LAB_0019e2dc;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,(ulong)local_818);
      }
      else {
LAB_0019e2dc:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_818,(ulong)local_558);
      }
      local_898 = &local_888;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_888 = *puVar12;
        lStack_880 = puVar5[3];
      }
      else {
        local_888 = *puVar12;
        local_898 = (ulong *)*puVar5;
      }
      local_890 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_898);
      local_8d8 = &local_8c8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_8c8 = *puVar12;
        lStack_8c0 = plVar4[3];
      }
      else {
        local_8c8 = *puVar12;
        local_8d8 = (ulong *)*plVar4;
      }
      local_8d0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_678 = &local_668;
      std::__cxx11::string::_M_construct((ulong)&local_678,'\t');
      uVar11 = 0xf;
      if (local_8d8 != &local_8c8) {
        uVar11 = local_8c8;
      }
      if (uVar11 < (ulong)(local_670 + local_8d0)) {
        uVar11 = 0xf;
        if (local_678 != &local_668) {
          uVar11 = local_668;
        }
        if (uVar11 < (ulong)(local_670 + local_8d0)) goto LAB_0019e41d;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_678,0,(char *)0x0,(ulong)local_8d8);
      }
      else {
LAB_0019e41d:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8d8,(ulong)local_678);
      }
      local_8b8 = &local_8a8;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_8a8 = *puVar12;
        lStack_8a0 = puVar5[3];
      }
      else {
        local_8a8 = *puVar12;
        local_8b8 = (ulong *)*puVar5;
      }
      local_8b0 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_8b8);
      local_6b8 = &local_6a8;
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_6a8 = *puVar12;
        lStack_6a0 = plVar4[3];
      }
      else {
        local_6a8 = *puVar12;
        local_6b8 = (ulong *)*plVar4;
      }
      local_6b0 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_6b8,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      puVar12 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar12) {
        local_588 = *puVar12;
        lStack_580 = plVar4[3];
        local_598 = &local_588;
      }
      else {
        local_588 = *puVar12;
        local_598 = (ulong *)*plVar4;
      }
      local_590 = plVar4[1];
      *plVar4 = (long)puVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_598);
      local_738 = &local_728;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_728 = *puVar12;
        lStack_720 = puVar5[3];
      }
      else {
        local_728 = *puVar12;
        local_738 = (ulong *)*puVar5;
      }
      local_730 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_738);
      local_5d8 = &local_5c8;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_5c8 = *plVar4;
        lStack_5c0 = puVar5[3];
      }
      else {
        local_5c8 = *plVar4;
        local_5d8 = (long *)*puVar5;
      }
      local_5d0 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_5d8,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_658 = &local_648;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_648 = *puVar12;
        lStack_640 = puVar5[3];
      }
      else {
        local_648 = *puVar12;
        local_658 = (ulong *)*puVar5;
      }
      local_650 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
      local_778 = &local_768;
      puVar12 = puVar5 + 2;
      local_518 = &local_508;
      if ((ulong *)*puVar5 == puVar12) {
        local_768 = *puVar12;
        lStack_760 = puVar5[3];
      }
      else {
        local_768 = *puVar12;
        local_778 = (ulong *)*puVar5;
      }
      local_770 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_construct((ulong)&local_518,'\f');
      uVar11 = 0xf;
      if (local_778 != &local_768) {
        uVar11 = local_768;
      }
      if (uVar11 < (ulong)(local_510 + local_770)) {
        uVar11 = 0xf;
        if (local_518 != &local_508) {
          uVar11 = local_508;
        }
        if (uVar11 < (ulong)(local_510 + local_770)) goto LAB_0019e77e;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_518,0,(char *)0x0,(ulong)local_778);
      }
      else {
LAB_0019e77e:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_778,(ulong)local_518);
      }
      local_7d8 = &local_7c8;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_7c8 = *puVar12;
        lStack_7c0 = puVar5[3];
      }
      else {
        local_7c8 = *puVar12;
        local_7d8 = (ulong *)*puVar5;
      }
      local_7d0 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_7d8);
      local_6f8 = &local_6e8;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_6e8 = *puVar12;
        lStack_6e0 = puVar5[3];
      }
      else {
        local_6e8 = *puVar12;
        local_6f8 = (ulong *)*puVar5;
      }
      local_6f0 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_6f8,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_6c8 = *puVar12;
        lStack_6c0 = puVar5[3];
        local_6d8 = &local_6c8;
      }
      else {
        local_6c8 = *puVar12;
        local_6d8 = (ulong *)*puVar5;
      }
      local_6d0 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_6d8);
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_7a8 = *puVar12;
        lStack_7a0 = puVar5[3];
        local_7b8 = &local_7a8;
      }
      else {
        local_7a8 = *puVar12;
        local_7b8 = (ulong *)*puVar5;
      }
      local_7b0 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      local_578 = &local_568;
      std::__cxx11::string::_M_construct((ulong)&local_578,'\x06');
      uVar11 = 0xf;
      if (local_7b8 != &local_7a8) {
        uVar11 = local_7a8;
      }
      if (uVar11 < (ulong)(local_570 + local_7b0)) {
        uVar11 = 0xf;
        if (local_578 != &local_568) {
          uVar11 = local_568;
        }
        if (uVar11 < (ulong)(local_570 + local_7b0)) goto LAB_0019e9bf;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_578,0,(char *)0x0,(ulong)local_7b8);
      }
      else {
LAB_0019e9bf:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7b8,(ulong)local_578);
      }
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_788 = *puVar12;
        lStack_780 = puVar5[3];
        local_798 = &local_788;
      }
      else {
        local_788 = *puVar12;
        local_798 = (ulong *)*puVar5;
      }
      local_790 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)puVar12 = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_798);
      local_698 = &local_688;
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_688 = *puVar12;
        lStack_680 = puVar5[3];
      }
      else {
        local_688 = *puVar12;
        local_698 = (ulong *)*puVar5;
      }
      local_690 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_698,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      this = local_3f8;
      local_858 = &local_848;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_848 = *plVar4;
        lStack_840 = puVar5[3];
      }
      else {
        local_848 = *plVar4;
        local_858 = (long *)*puVar5;
      }
      local_850 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_858);
      puVar12 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar12) {
        local_828 = *puVar12;
        lStack_820 = puVar5[3];
        local_838 = &local_828;
      }
      else {
        local_828 = *puVar12;
        local_838 = (ulong *)*puVar5;
      }
      local_830 = puVar5[1];
      *puVar5 = puVar12;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_418,(ulong)local_838);
      if (local_838 != &local_828) {
        operator_delete(local_838);
      }
      if (local_858 != &local_848) {
        operator_delete(local_858);
      }
      if (local_698 != &local_688) {
        operator_delete(local_698);
      }
      if (local_798 != &local_788) {
        operator_delete(local_798);
      }
      if (local_578 != &local_568) {
        operator_delete(local_578);
      }
      if (local_7b8 != &local_7a8) {
        operator_delete(local_7b8);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8);
      }
      if (local_6f8 != &local_6e8) {
        operator_delete(local_6f8);
      }
      if (local_7d8 != &local_7c8) {
        operator_delete(local_7d8);
      }
      if (local_518 != &local_508) {
        operator_delete(local_518);
      }
      if (local_778 != &local_768) {
        operator_delete(local_778);
      }
      if (local_658 != &local_648) {
        operator_delete(local_658);
      }
      if (local_5d8 != &local_5c8) {
        operator_delete(local_5d8);
      }
      if (local_738 != &local_728) {
        operator_delete(local_738);
      }
      if (local_598 != &local_588) {
        operator_delete(local_598);
      }
      if (local_6b8 != &local_6a8) {
        operator_delete(local_6b8);
      }
      if (local_8b8 != &local_8a8) {
        operator_delete(local_8b8);
      }
      if (local_678 != &local_668) {
        operator_delete(local_678);
      }
      if (local_8d8 != &local_8c8) {
        operator_delete(local_8d8);
      }
      if (local_898 != &local_888) {
        operator_delete(local_898);
      }
      if (local_558 != &local_548) {
        operator_delete(local_558);
      }
      if (local_818 != &local_808) {
        operator_delete(local_818);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
        operator_delete(local_7f8._M_dataplus._M_p);
      }
      if (local_638 != &local_628) {
        operator_delete(local_638);
      }
      if (local_5f8 != &local_5e8) {
        operator_delete(local_5f8);
      }
      if (local_538 != &local_528) {
        operator_delete(local_538);
      }
      if (local_618 != &local_608) {
        operator_delete(local_618);
      }
      if (local_718 != &local_708) {
        operator_delete(local_718);
      }
      if (local_758 != &local_748) {
        operator_delete(local_758);
      }
      if (local_878 != &local_868) {
        operator_delete(local_878);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p);
      }
      plVar4 = local_230;
      if (local_230 != &local_220) {
LAB_0019b2fd:
        operator_delete(plVar4);
      }
    }
    uVar19 = uVar19 + 1;
  }
  local_558 = &local_548;
  std::__cxx11::string::_M_construct((ulong)&local_558,'\x03');
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_558);
  local_638 = &local_628;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_628 = *puVar12;
    lStack_620 = plVar4[3];
  }
  else {
    local_628 = *puVar12;
    local_638 = (ulong *)*plVar4;
  }
  local_630 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_678 = &local_668;
  std::__cxx11::string::_M_construct((ulong)&local_678,'\x03');
  uVar19 = 0xf;
  if (local_638 != &local_628) {
    uVar19 = local_628;
  }
  if (uVar19 < (ulong)(local_670 + local_630)) {
    uVar19 = 0xf;
    if (local_678 != &local_668) {
      uVar19 = local_668;
    }
    if (uVar19 < (ulong)(local_670 + local_630)) goto LAB_0019efbc;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_678,0,(char *)0x0,(ulong)local_638);
  }
  else {
LAB_0019efbc:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_638,(ulong)local_678);
  }
  local_878 = &local_868;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_868 = *puVar12;
    lStack_860 = puVar5[3];
  }
  else {
    local_868 = *puVar12;
    local_878 = (ulong *)*puVar5;
  }
  local_870 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_878);
  local_758 = &local_748;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_748 = *puVar12;
    lStack_740 = plVar4[3];
  }
  else {
    local_748 = *puVar12;
    local_758 = (ulong *)*plVar4;
  }
  local_750 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_518 = &local_508;
  std::__cxx11::string::_M_construct((ulong)&local_518,'\x06');
  uVar19 = 0xf;
  if (local_758 != &local_748) {
    uVar19 = local_748;
  }
  if (uVar19 < (ulong)(local_510 + local_750)) {
    uVar19 = 0xf;
    if (local_518 != &local_508) {
      uVar19 = local_508;
    }
    if (uVar19 < (ulong)(local_510 + local_750)) goto LAB_0019f125;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_518,0,(char *)0x0,(ulong)local_758);
  }
  else {
LAB_0019f125:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_758,(ulong)local_518);
  }
  local_718 = &local_708;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_708 = *puVar12;
    lStack_700 = puVar5[3];
  }
  else {
    local_708 = *puVar12;
    local_718 = (ulong *)*puVar5;
  }
  local_710 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_718);
  local_618 = &local_608;
  plVar13 = plVar4 + 2;
  if ((long *)*plVar4 == plVar13) {
    local_608 = *plVar13;
    lStack_600 = plVar4[3];
  }
  else {
    local_608 = *plVar13;
    local_618 = (long *)*plVar4;
  }
  local_610 = plVar4[1];
  *plVar4 = (long)plVar13;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_618);
  local_538 = &local_528;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_528 = *puVar12;
    lStack_520 = plVar4[3];
  }
  else {
    local_528 = *puVar12;
    local_538 = (ulong *)*plVar4;
  }
  local_530 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_538,(ulong)local_270);
  local_5f8 = &local_5e8;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_5e8 = *puVar12;
    lStack_5e0 = plVar4[3];
  }
  else {
    local_5e8 = *puVar12;
    local_5f8 = (ulong *)*plVar4;
  }
  local_5f0 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5f8);
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_7f8.field_2._M_allocated_capacity = *puVar12;
    local_7f8.field_2._8_8_ = plVar4[3];
  }
  else {
    local_7f8.field_2._M_allocated_capacity = *puVar12;
    local_7f8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_7f8._M_string_length = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_578 = &local_568;
  std::__cxx11::string::_M_construct((ulong)&local_578,'\x06');
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    uVar17 = local_7f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_570 + local_7f8._M_string_length) {
    uVar19 = 0xf;
    if (local_578 != &local_568) {
      uVar19 = local_568;
    }
    if (uVar19 < local_570 + local_7f8._M_string_length) goto LAB_0019f3c6;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_578,0,(char *)0x0,(ulong)local_7f8._M_dataplus._M_p);
  }
  else {
LAB_0019f3c6:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7f8,(ulong)local_578);
  }
  local_818 = &local_808;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_808 = *puVar12;
    lStack_800 = puVar5[3];
  }
  else {
    local_808 = *puVar12;
    local_818 = (ulong *)*puVar5;
  }
  local_810 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_818);
  local_898 = &local_888;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_888 = *puVar12;
    lStack_880 = plVar4[3];
  }
  else {
    local_888 = *puVar12;
    local_898 = (ulong *)*plVar4;
  }
  local_890 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_898);
  local_8d8 = &local_8c8;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_8c8 = *puVar12;
    lStack_8c0 = plVar4[3];
  }
  else {
    local_8c8 = *puVar12;
    local_8d8 = (ulong *)*plVar4;
  }
  local_8d0 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_4f8 = &local_4e8;
  std::__cxx11::string::_M_construct((ulong)&local_4f8,'\x06');
  uVar19 = 0xf;
  if (local_8d8 != &local_8c8) {
    uVar19 = local_8c8;
  }
  if (uVar19 < (ulong)(local_4f0 + local_8d0)) {
    uVar19 = 0xf;
    if (local_4f8 != &local_4e8) {
      uVar19 = local_4e8;
    }
    if (uVar19 < (ulong)(local_4f0 + local_8d0)) goto LAB_0019f56a;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4f8,0,(char *)0x0,(ulong)local_8d8);
  }
  else {
LAB_0019f56a:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8d8,(ulong)local_4f8);
  }
  local_8b8 = &local_8a8;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_8a8 = *puVar12;
    lStack_8a0 = puVar5[3];
  }
  else {
    local_8a8 = *puVar12;
    local_8b8 = (ulong *)*puVar5;
  }
  local_8b0 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_8b8);
  local_6b8 = &local_6a8;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_6a8 = *puVar12;
    lStack_6a0 = plVar4[3];
  }
  else {
    local_6a8 = *puVar12;
    local_6b8 = (ulong *)*plVar4;
  }
  local_6b0 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_6b8);
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_588 = *puVar12;
    lStack_580 = plVar4[3];
    local_598 = &local_588;
  }
  else {
    local_588 = *puVar12;
    local_598 = (ulong *)*plVar4;
  }
  local_590 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_498 = &local_488;
  std::__cxx11::string::_M_construct((ulong)&local_498,'\x06');
  uVar19 = 0xf;
  if (local_598 != &local_588) {
    uVar19 = local_588;
  }
  if (uVar19 < (ulong)(local_490 + local_590)) {
    uVar19 = 0xf;
    if (local_498 != &local_488) {
      uVar19 = local_488;
    }
    if (uVar19 < (ulong)(local_490 + local_590)) goto LAB_0019f714;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_498,0,(char *)0x0,(ulong)local_598);
  }
  else {
LAB_0019f714:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_598,(ulong)local_498);
  }
  local_738 = &local_728;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_728 = *puVar12;
    lStack_720 = puVar5[3];
  }
  else {
    local_728 = *puVar12;
    local_738 = (ulong *)*puVar5;
  }
  local_730 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_738);
  local_5d8 = &local_5c8;
  plVar13 = plVar4 + 2;
  if ((long *)*plVar4 == plVar13) {
    local_5c8 = *plVar13;
    lStack_5c0 = plVar4[3];
  }
  else {
    local_5c8 = *plVar13;
    local_5d8 = (long *)*plVar4;
  }
  local_5d0 = plVar4[1];
  *plVar4 = (long)plVar13;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5d8);
  local_658 = &local_648;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_648 = *puVar12;
    lStack_640 = plVar4[3];
  }
  else {
    local_648 = *puVar12;
    local_658 = (ulong *)*plVar4;
  }
  local_650 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_458 = &local_448;
  std::__cxx11::string::_M_construct((ulong)&local_458,'\x06');
  uVar19 = 0xf;
  if (local_658 != &local_648) {
    uVar19 = local_648;
  }
  if (uVar19 < (ulong)(local_450 + local_650)) {
    uVar19 = 0xf;
    if (local_458 != &local_448) {
      uVar19 = local_448;
    }
    if (uVar19 < (ulong)(local_450 + local_650)) goto LAB_0019f8e2;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_458,0,(char *)0x0,(ulong)local_658);
  }
  else {
LAB_0019f8e2:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_658,(ulong)local_458);
  }
  local_778 = &local_768;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_768 = *puVar12;
    lStack_760 = puVar5[3];
  }
  else {
    local_768 = *puVar12;
    local_778 = (ulong *)*puVar5;
  }
  local_770 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_778);
  local_7d8 = &local_7c8;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_7c8 = *puVar12;
    lStack_7c0 = plVar4[3];
  }
  else {
    local_7c8 = *puVar12;
    local_7d8 = (ulong *)*plVar4;
  }
  local_7d0 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_478 = &local_468;
  std::__cxx11::string::_M_construct((ulong)&local_478,'\x06');
  uVar19 = 0xf;
  if (local_7d8 != &local_7c8) {
    uVar19 = local_7c8;
  }
  if (uVar19 < (ulong)(local_470 + local_7d0)) {
    uVar19 = 0xf;
    if (local_478 != &local_468) {
      uVar19 = local_468;
    }
    if (uVar19 < (ulong)(local_470 + local_7d0)) goto LAB_0019fa4b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,(ulong)local_7d8);
  }
  else {
LAB_0019fa4b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7d8,(ulong)local_478);
  }
  local_6f8 = &local_6e8;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_6e8 = *puVar12;
    lStack_6e0 = puVar5[3];
  }
  else {
    local_6e8 = *puVar12;
    local_6f8 = (ulong *)*puVar5;
  }
  local_6f0 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_6f8);
  local_6d8 = &local_6c8;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_6c8 = *puVar12;
    lStack_6c0 = plVar4[3];
  }
  else {
    local_6c8 = *puVar12;
    local_6d8 = (ulong *)*plVar4;
  }
  local_6d0 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_4b8 = &local_4a8;
  std::__cxx11::string::_M_construct((ulong)&local_4b8,'\x06');
  uVar19 = 0xf;
  if (local_6d8 != &local_6c8) {
    uVar19 = local_6c8;
  }
  if (uVar19 < (ulong)(local_4b0 + local_6d0)) {
    uVar19 = 0xf;
    if (local_4b8 != &local_4a8) {
      uVar19 = local_4a8;
    }
    if (uVar19 < (ulong)(local_4b0 + local_6d0)) goto LAB_0019fbb4;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4b8,0,(char *)0x0,(ulong)local_6d8);
  }
  else {
LAB_0019fbb4:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_4b8);
  }
  local_7b8 = &local_7a8;
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_7a8 = *puVar12;
    lStack_7a0 = puVar5[3];
  }
  else {
    local_7a8 = *puVar12;
    local_7b8 = (ulong *)*puVar5;
  }
  local_7b0 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_7b8);
  local_798 = &local_788;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_788 = *puVar12;
    lStack_780 = plVar4[3];
  }
  else {
    local_788 = *puVar12;
    local_798 = (ulong *)*plVar4;
  }
  local_790 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_798,(ulong)local_8f8);
  local_698 = &local_688;
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_688 = *puVar12;
    lStack_680 = plVar4[3];
  }
  else {
    local_688 = *puVar12;
    local_698 = (ulong *)*plVar4;
  }
  local_690 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_4d8 = &local_4c8;
  std::__cxx11::string::_M_construct((ulong)&local_4d8,'\x06');
  uVar19 = 0xf;
  if (local_698 != &local_688) {
    uVar19 = local_688;
  }
  if (uVar19 < (ulong)(local_4d0 + local_690)) {
    uVar19 = 0xf;
    if (local_4d8 != &local_4c8) {
      uVar19 = local_4c8;
    }
    if (uVar19 < (ulong)(local_4d0 + local_690)) goto LAB_0019fd84;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4d8,0,(char *)0x0,(ulong)local_698);
  }
  else {
LAB_0019fd84:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_698,(ulong)local_4d8);
  }
  local_858 = &local_848;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_848 = *plVar4;
    lStack_840 = puVar5[3];
  }
  else {
    local_848 = *plVar4;
    local_858 = (long *)*puVar5;
  }
  local_850 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_858);
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_828 = *puVar12;
    lStack_820 = puVar5[3];
    local_838 = &local_828;
  }
  else {
    local_828 = *puVar12;
    local_838 = (ulong *)*puVar5;
  }
  local_830 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_438 = local_428;
  std::__cxx11::string::_M_construct((ulong)&local_438,'\x03');
  uVar19 = 0xf;
  if (local_838 != &local_828) {
    uVar19 = local_828;
  }
  if (uVar19 < (ulong)(local_430 + local_830)) {
    uVar19 = 0xf;
    if (local_438 != local_428) {
      uVar19 = local_428[0];
    }
    if ((ulong)(local_430 + local_830) <= uVar19) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,(ulong)local_838);
      goto LAB_0019ff07;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_838,(ulong)local_438);
LAB_0019ff07:
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_220 = *plVar4;
    uStack_218 = puVar5[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar4;
    local_230 = (long *)*puVar5;
  }
  local_228 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
  psVar15 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_5b8.field_2._M_allocated_capacity = *psVar15;
    local_5b8.field_2._8_8_ = plVar4[3];
    local_5b8._M_dataplus._M_p = (pointer)paVar18;
  }
  else {
    local_5b8.field_2._M_allocated_capacity = *psVar15;
    local_5b8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_5b8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar15;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  if (local_838 != &local_828) {
    operator_delete(local_838);
  }
  if (local_858 != &local_848) {
    operator_delete(local_858);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8);
  }
  if (local_698 != &local_688) {
    operator_delete(local_698);
  }
  if (local_798 != &local_788) {
    operator_delete(local_798);
  }
  if (local_7b8 != &local_7a8) {
    operator_delete(local_7b8);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8);
  }
  if (local_6d8 != &local_6c8) {
    operator_delete(local_6d8);
  }
  if (local_6f8 != &local_6e8) {
    operator_delete(local_6f8);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478);
  }
  if (local_7d8 != &local_7c8) {
    operator_delete(local_7d8);
  }
  if (local_778 != &local_768) {
    operator_delete(local_778);
  }
  if (local_458 != &local_448) {
    operator_delete(local_458);
  }
  if (local_658 != &local_648) {
    operator_delete(local_658);
  }
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8);
  }
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  if (local_498 != &local_488) {
    operator_delete(local_498);
  }
  if (local_598 != &local_588) {
    operator_delete(local_598);
  }
  if (local_6b8 != &local_6a8) {
    operator_delete(local_6b8);
  }
  if (local_8b8 != &local_8a8) {
    operator_delete(local_8b8);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8);
  }
  if (local_8d8 != &local_8c8) {
    operator_delete(local_8d8);
  }
  if (local_898 != &local_888) {
    operator_delete(local_898);
  }
  if (local_818 != &local_808) {
    operator_delete(local_818);
  }
  if (local_578 != &local_568) {
    operator_delete(local_578);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p);
  }
  if (local_5f8 != &local_5e8) {
    operator_delete(local_5f8);
  }
  if (local_538 != &local_528) {
    operator_delete(local_538);
  }
  if (local_618 != &local_608) {
    operator_delete(local_618);
  }
  if (local_718 != &local_708) {
    operator_delete(local_718);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518);
  }
  if (local_758 != &local_748) {
    operator_delete(local_758);
  }
  if (local_878 != &local_868) {
    operator_delete(local_878);
  }
  if (local_678 != &local_668) {
    operator_delete(local_678);
  }
  if (local_638 != &local_628) {
    operator_delete(local_638);
  }
  if (local_558 != &local_548) {
    operator_delete(local_558);
  }
  local_838 = &local_828;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_838,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_838);
  std::ofstream::ofstream(&local_230,(string *)&local_838,_S_out);
  if (local_838 != &local_828) {
    operator_delete(local_838);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"#include \"DataHandler.h\"\n\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"namespace lmfao\n{\n",0x12);
  local_858 = &local_848;
  std::__cxx11::string::_M_construct((ulong)&local_858,'\x03');
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_858);
  puVar12 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar12) {
    local_828 = *puVar12;
    lStack_820 = puVar5[3];
    local_838 = &local_828;
  }
  else {
    local_828 = *puVar12;
    local_838 = (ulong *)*puVar5;
  }
  local_830 = puVar5[1];
  *puVar5 = puVar12;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(char *)local_838,local_830);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n",0x2f);
  if (local_838 != &local_828) {
    operator_delete(local_838);
  }
  if (local_858 != &local_848) {
    operator_delete(local_858);
  }
  std::ofstream::close();
  local_838 = &local_828;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_838,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_838);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_838);
  if (local_838 != &local_828) {
    operator_delete(local_838);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"#include \"ApplicationHandler.h\"\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"namespace lmfao\n{\n",0x12);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"}\n",2);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)((long)&local_230 + _VTT[-3]) = _error_with_option_name;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar18) {
    operator_delete(local_5b8._M_dataplus._M_p);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418);
  }
  if (local_8f8 != &local_8e8) {
    operator_delete(local_8f8);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  return;
}

Assistant:

void Percentile::generateCode()
{
    Query* countQuery = varToQuery[NUM_OF_VARIABLES];
    size_t& countViewID = countQuery->_aggregates[0]->_incoming[0].first;
    size_t& countAggID = countQuery->_aggregates[0]->_incoming[0].second;

    std::string numPercStr = to_string(numberOfPercentiles);

    std::string percentileComp =
        // offset(1)+"void computePercentiles()\n"+offset(1)+"{\n"+
        offset(2)+"size_t tupleCount = (size_t)V"+to_string(countViewID)+
        "[0].aggregates["+to_string(countAggID)+"], offset = 0, pIndex = 0;\n"+
        offset(2)+"size_t percentileCounts["+numPercStr+"];\n"+
        offset(2)+"for (size_t i = 1; i < "+numPercStr+"; i++)\n"+
        offset(3)+"percentileCounts[i-1] = ceil("+
        to_string(100.0/(numberOfPercentiles*100))+"*i*tupleCount);\n\n";

    std::string printPerc = "", printPercTensorFlow = "";
    
    // Create a query & Aggregate
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    {
        std::string& attName =  _td->getAttribute(var)->_name;

        if (_isFeature[var] && !_isCategoricalFeature[var])
        {
            Query* query = varToQuery[var];
            const size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            const size_t& aggID = query->_aggregates[0]->_incoming[0].second;

            std::string viewStr = "V"+to_string(viewID);
            std::string typeStr = typeToStr(_td->getAttribute(var)->_type);
            
            percentileComp += offset(2)+"offset = 0; pIndex = 0;\n"+
                offset(2)+typeStr+" percentiles"+attName+"["+
                to_string(numberOfPercentiles-1)+"];\n"+
                offset(2)+"for ("+viewStr+"_tuple& tuple : "+viewStr+")\n"+
                offset(2)+"{\n"+
                offset(3)+"offset += tuple.aggregates["+to_string(aggID)+"];\n"+
                offset(3)+"while(offset >= percentileCounts[pIndex])\n"+offset(3)+"{\n"+
                offset(4)+"percentiles"+attName+"[pIndex] = tuple."+attName+";\n"+
                offset(4)+"++pIndex;\n"+offset(3)+"}\n"+
                offset(2)+"}\n\n";

            printPerc += offset(2)+"std::cout << \"{\"<<percentiles"+attName+"[0];\n"+
                offset(2)+"for (size_t p = 1; p < "+
                to_string(numberOfPercentiles-1)+"; ++p)\n"+
                offset(3)+"if (percentiles"+attName+"[p] != "+
                "percentiles"+attName+"[p-1])\n"+
                offset(4)+"std::cout << \",\" << percentiles"+attName+"[p];\n"+
                offset(2)+"std::cout << \"},// percentiles "+attName+"\"<< std::endl;\n";

            // 
            printPercTensorFlow += offset(2)+"std::cout << \"\'"+attName+"\': \" << \"[\"<<percentiles"+attName+"[0];\n"+
                offset(2)+"for (size_t p = 1; p < "+
                to_string(numberOfPercentiles-1)+"; ++p)\n"+
                offset(3)+"if (percentiles"+attName+"[p] != "+
                "percentiles"+attName+"[p-1])\n"+
                offset(4)+"std::cout << \",\" << percentiles"+attName+"[p];\n"+
                offset(2)+"std::cout << \"],  ## percentiles "+attName+"\"<< std::endl;\n";
        }
        else
        {
            printPerc += offset(2)+"std::cout << \"{},// percentiles "+attName+
                "\"<<std::endl;\n";
        }
    }
    // percentileComp += printPerc+offset(1)+"}\n\n";
    
    std::string runFunction = offset(1)+"void runApplication()\n"+offset(1)+"{\n"+
        offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n"+percentileComp+
        "\n"+offset(2)+"int64_t endProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
        offset(2)+"std::cout << \"Run Application: \"+"+
        "std::to_string(endProcess)+\"ms.\\n\";\n\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | " +
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << endProcess << std::endl;\n"+
        offset(2)+"ofs.close();\n\n"+
        offset(2)+"std::cout << \"_thresholds = {\\n\";"+
        printPerc+
        // printPercTensorFlow+ // uncomment this for the percentiles used for tensorflow
        offset(2)+"std::cout << \"};\\n\";"+
        offset(1)+"}\n";
        
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.h", std::ofstream::out);
    ofs << "#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n"<<
        "#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n"<<
        "#include \"DataHandler.h\"\n\n"<<
        "namespace lmfao\n{\n"<<
        offset(1)+"void runApplication();\n"<<
        "}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n";    
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.cpp", std::ofstream::out);
    ofs << "#include \"ApplicationHandler.h\"\n"
        << "namespace lmfao\n{\n";
    ofs << runFunction << std::endl;
    ofs << "}\n";
    ofs.close();
    
}